

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestInterruptChild::Run(SubprocessTestInterruptChild *this)

{
  SubprocessSet *this_00;
  Test *this_01;
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *this_02;
  allocator<char> local_41;
  string local_40;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"kill -INT $$",&local_41);
  this_02 = SubprocessSet::Add(this_00,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::Test::Check
                    (g_current_test,this_02 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x6a,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    (this->super_SubprocessTest).subprocs_.token_available_ = false;
    while( true ) {
      bVar1 = Subprocess::Done(this_02);
      if (bVar1) break;
      SubprocessSet::DoWork(this_00,(TokenPool *)0x0);
    }
    bVar1 = testing::Test::Check
                      (g_current_test,
                       (bool)((this->super_SubprocessTest).subprocs_.token_available_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x70,"subprocs_.IsTokenAvailable()");
    this_01 = g_current_test;
    if (bVar1) {
      EVar2 = Subprocess::Finish(this_02);
      testing::Test::Check
                (this_01,EVar2 == ExitInterrupted,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                 ,0x72,"ExitInterrupted == subproc->Finish()");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChild) {
  Subprocess* subproc = subprocs_.Add("kill -INT $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}